

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

void __thiscall
rw::PluginList::assertRights(PluginList *this,void *object,uint32 pluginID,uint32 data)

{
  Plugin *pPVar1;
  Plugin *pPVar2;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  uint32 data_local;
  uint32 pluginID_local;
  void *object_local;
  PluginList *this_local;
  
  pPVar1 = (Plugin *)(this->plugins).link.next;
  do {
    p = pPVar1;
    pPVar1 = *(Plugin **)p;
    pPVar2 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar2) {
      return;
    }
  } while (*(uint32 *)&p[-1].read != pluginID);
  if (p[-1].inParentList.prev != (LLLink *)0x0) {
    (*(code *)p[-1].inParentList.prev)
              (object,*(undefined4 *)&p[-1].copy,*(undefined4 *)((long)&p[-1].copy + 4),data);
  }
  return;
}

Assistant:

void
PluginList::assertRights(void *object, uint32 pluginID, uint32 data)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == pluginID){
			if(p->rightsCallback)
				p->rightsCallback(object,
				                  p->offset, p->size, data);
			return;
		}
	}
}